

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_execSequenceEnd
                 (BYTE *op,BYTE *oend,seq_t sequence,BYTE **litPtr,BYTE *litLimit,BYTE *prefixStart,
                 BYTE *virtualStart,BYTE *dictEnd)

{
  void *__dest;
  BYTE *op_00;
  BYTE *pBVar1;
  BYTE *ip;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  ulong in_RDI;
  BYTE *in_R8;
  long in_R9;
  ulong in_stack_00000008;
  size_t length1;
  BYTE *oend_w;
  BYTE *match;
  BYTE *iLitEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  ZSTD_overlap_e ovtype;
  size_t in_stack_ffffffffffffff98;
  ulong local_8;
  
  __dest = (void *)(in_RDI + in_stack_00000008);
  local_8 = in_stack_00000008 + length1;
  op_00 = (BYTE *)(*in_RDX + in_stack_00000008);
  pBVar1 = (BYTE *)((long)__dest - (long)oend_w);
  ip = (BYTE *)(in_RSI + -0x20);
  if (in_RSI - in_RDI < local_8) {
    local_8 = 0xffffffffffffffba;
  }
  else if ((ulong)(in_RCX - *in_RDX) < in_stack_00000008) {
    local_8 = 0xffffffffffffffec;
  }
  else {
    if (in_RDI + local_8 <= in_RDI) {
      __assert_fail("op < op + sequenceLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa7f6,
                    "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if ((void *)(in_RDI + local_8) <= __dest) {
      __assert_fail("oLitEnd < op + sequenceLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,42999,
                    "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    ovtype = (ZSTD_overlap_e)((ulong)&stack0x00000008 >> 0x20);
    ZSTD_safecopy(op_00,pBVar1,ip,in_stack_ffffffffffffff98,ovtype);
    *in_RDX = (long)op_00;
    if ((BYTE *)((long)__dest - (long)in_R8) < oend_w) {
      if ((BYTE *)((long)__dest - in_R9) < oend_w) {
        return 0xffffffffffffffec;
      }
      pBVar1 = match + -((long)in_R8 - (long)pBVar1);
      if (pBVar1 + length1 <= match) {
        memmove(__dest,pBVar1,length1);
        return local_8;
      }
      in_stack_ffffffffffffff98 = (long)match - (long)pBVar1;
      memmove(__dest,pBVar1,in_stack_ffffffffffffff98);
      pBVar1 = in_R8;
    }
    ZSTD_safecopy(op_00,pBVar1,ip,in_stack_ffffffffffffff98,ovtype);
  }
  return local_8;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceEnd(BYTE* op,
    BYTE* const oend, seq_t sequence,
    const BYTE** litPtr, const BYTE* const litLimit,
    const BYTE* const prefixStart, const BYTE* const virtualStart, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;
    BYTE* const oend_w = oend - WILDCOPY_OVERLENGTH;

    /* bounds checks : careful of address space overflow in 32-bit mode */
    RETURN_ERROR_IF(sequenceLength > (size_t)(oend - op), dstSize_tooSmall, "last match must fit within dstBuffer");
    RETURN_ERROR_IF(sequence.litLength > (size_t)(litLimit - *litPtr), corruption_detected, "try to read beyond literal buffer");
    assert(op < op + sequenceLength);
    assert(oLitEnd < op + sequenceLength);

    /* copy literals */
    ZSTD_safecopy(op, oend_w, *litPtr, sequence.litLength, ZSTD_no_overlap);
    op = oLitEnd;
    *litPtr = iLitEnd;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - prefixStart)) {
        /* offset beyond prefix */
        RETURN_ERROR_IF(sequence.offset > (size_t)(oLitEnd - virtualStart), corruption_detected, "");
        match = dictEnd - (prefixStart - match);
        if (match + sequence.matchLength <= dictEnd) {
            ZSTD_memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
        ZSTD_memmove(oLitEnd, match, length1);
        op = oLitEnd + length1;
        sequence.matchLength -= length1;
        match = prefixStart;
        }
    }
    ZSTD_safecopy(op, oend_w, match, sequence.matchLength, ZSTD_overlap_src_before_dst);
    return sequenceLength;
}